

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void cteClear(sqlite3 *db,Cte *pCte)

{
  if (pCte->pCols != (ExprList *)0x0) {
    exprListDeleteNN(db,pCte->pCols);
  }
  if (pCte->pSelect != (Select *)0x0) {
    clearSelect(db,pCte->pSelect,1);
  }
  if (pCte->zName != (char *)0x0) {
    sqlite3DbFreeNN(db,pCte->zName);
    return;
  }
  return;
}

Assistant:

static void cteClear(sqlite3 *db, Cte *pCte){
  assert( pCte!=0 );
  sqlite3ExprListDelete(db, pCte->pCols);
  sqlite3SelectDelete(db, pCte->pSelect);
  sqlite3DbFree(db, pCte->zName);
}